

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::~NPC(NPC *this)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  long lVar1;
  NPC *in_RAX;
  list<Character_*,_std::allocator<Character_*>_> *plVar2;
  _List_iterator<NPC_*> __first;
  _List_node_base *p_Var3;
  _List_iterator<NPC_*> __last;
  NPC *local_38;
  
  plVar2 = &this->map->characters;
  p_Var3 = (_List_node_base *)plVar2;
  while (p_Var3 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar2) {
    lVar1 = (long)p_Var3[1]._M_next;
    if (*(NPC **)(lVar1 + 0x1d0) == this) {
      *(undefined8 *)(lVar1 + 0x1d0) = 0;
      *(undefined4 *)(lVar1 + 0x1d8) = 0;
    }
  }
  this_00 = &this->damagelist;
  p_Var3 = (_List_node_base *)this_00;
  local_38 = in_RAX;
  while (p_Var3 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)this_00) {
    __last._M_node = (_List_node_base *)(*(long *)p_Var3[1]._M_next + 0x378);
    local_38 = this;
    __first = std::
              __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                        (*(_List_node_base **)(*(long *)p_Var3[1]._M_next + 0x378),__last,
                         (_Iter_equals_val<NPC_*const>)&local_38);
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
              ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,(const_iterator)__first._M_node
               ,(_List_node_base *)(*(long *)p_Var3[1]._M_next + 0x378));
  }
  std::__cxx11::
  _List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            );
  return;
}

Assistant:

NPC::~NPC()
{
	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->npc == this)
		{
			character->npc = 0;
			character->npc_type = ENF::NPC;
		}
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}
}